

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystemData.cpp
# Opt level: O3

void __thiscall
DIS::AcousticEmitterSystemData::marshal(AcousticEmitterSystemData *this,DataStream *dataStream)

{
  undefined8 *puVar1;
  pointer pAVar2;
  ulong uVar3;
  long lVar4;
  AcousticBeamData x;
  AcousticBeamData local_60;
  
  DataStream::operator<<(dataStream,this->_emitterSystemDataLength);
  DataStream::operator<<
            (dataStream,
             (char)((uint)(*(int *)&(this->_beamRecords).
                                    super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->_beamRecords).
                                   super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55);
  DataStream::operator<<(dataStream,this->_pad2);
  AcousticEmitterSystem::marshal(&this->_acousticEmitterSystem,dataStream);
  Vector3Float::marshal(&this->_emitterLocation,dataStream);
  pAVar2 = (this->_beamRecords).
           super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->_beamRecords).
      super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar2) {
    lVar4 = 0x18;
    uVar3 = 0;
    do {
      local_60._vptr_AcousticBeamData = (_func_int **)&PTR__AcousticBeamData_0019f090;
      local_60._8_4_ = *(undefined4 *)((long)pAVar2 + lVar4 + -0x10);
      local_60._fundamentalDataParameters._vptr_AcousticBeamFundamentalParameter =
           (_func_int **)&PTR__AcousticBeamFundamentalParameter_0019f0d8;
      local_60._fundamentalDataParameters._deBeamwidth =
           *(float *)((long)&(pAVar2->_fundamentalDataParameters).
                             _vptr_AcousticBeamFundamentalParameter + lVar4);
      puVar1 = (undefined8 *)((long)&pAVar2->_vptr_AcousticBeamData + lVar4);
      local_60._fundamentalDataParameters._8_8_ = *puVar1;
      local_60._fundamentalDataParameters._16_8_ = puVar1[1];
      AcousticBeamData::marshal(&local_60,dataStream);
      AcousticBeamData::~AcousticBeamData(&local_60);
      uVar3 = uVar3 + 1;
      pAVar2 = (this->_beamRecords).
               super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x30;
    } while (uVar3 < (ulong)(((long)(this->_beamRecords).
                                    super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 4)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void AcousticEmitterSystemData::marshal(DataStream& dataStream) const
{
    dataStream << _emitterSystemDataLength;
    dataStream << ( unsigned char )_beamRecords.size();
    dataStream << _pad2;
    _acousticEmitterSystem.marshal(dataStream);
    _emitterLocation.marshal(dataStream);

     for(size_t idx = 0; idx < _beamRecords.size(); idx++)
     {
        AcousticBeamData x = _beamRecords[idx];
        x.marshal(dataStream);
     }

}